

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_event_trigger.c
# Opt level: O0

void * event_trigger_thread(void *param)

{
  int iVar1;
  long lVar2;
  long lVar3;
  RK_S32 ret;
  long curr;
  long start_time;
  timeval curr_time;
  event_ctx_impl *ctx;
  void *param_local;
  
  curr_time.tv_usec = (__suseconds_t)param;
  gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
  lVar2 = start_time * 1000;
  lVar3 = curr_time.tv_sec / 1000;
  event_create((event_ctx_impl *)curr_time.tv_usec);
  do {
    iVar1 = event_timed_wait((event_ctx_impl *)curr_time.tv_usec,
                             *(int *)(curr_time.tv_usec + 0x68) * 10000);
    if (*(int *)(curr_time.tv_usec + 0x78) == 0) break;
    if (iVar1 == 0x6e) {
      _mpp_log_l(2,0,"wait event timeout\n");
      break;
    }
    gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
    _mpp_log_l(4,0,"[%ld ms] event idx %d triggered\n",0,
               (start_time * 1000 + curr_time.tv_sec / 1000) - (lVar2 + lVar3),
               *(undefined4 *)(curr_time.tv_usec + 0x88));
    _mpp_log_l(4,0,"cnt %d\n",0,**(undefined4 **)(curr_time.tv_usec + 0x80));
    (**(code **)(curr_time.tv_usec + 8))
              (*(undefined8 *)(curr_time.tv_usec + 0x90),
               *(undefined8 *)
                (*(long *)(curr_time.tv_usec + 0x80) +
                 (long)(*(int *)(curr_time.tv_usec + 0x88) % **(int **)(curr_time.tv_usec + 0x80)) *
                 0x10 + 0x10));
    event_init((event_ctx_impl *)curr_time.tv_usec);
  } while (*(int *)(curr_time.tv_usec + 0x78) != 0);
  event_destroy((event_ctx_impl *)curr_time.tv_usec);
  _mpp_log_l(4,0,"exit\n","event_trigger_thread");
  return (void *)0x0;
}

Assistant:

static void *event_trigger_thread(void *param)
{
    struct event_ctx_impl *ctx = (struct event_ctx_impl *)param;
    struct timeval curr_time;
    long start_time, curr;
    RK_S32 ret;

    gettimeofday(&curr_time, NULL);

    start_time = curr_time.tv_sec * 1000 + curr_time.tv_usec / 1000;
    event_create(ctx);

    while (1) {
        ret = event_timed_wait(ctx, ctx->semval * 10000);
        if (!ctx->flag)
            break;

        if (ret == ETIMEDOUT) {
            mpp_err("wait event timeout\n");
            break;
        }

        gettimeofday(&curr_time, NULL);

        curr = curr_time.tv_sec * 1000 + curr_time.tv_usec / 1000;
        /* TODO, trigger event */
        mpp_log("[%ld ms] event idx %d triggered\n",
                curr - start_time, ctx->event_idx);
        mpp_log("cnt %d\n", ctx->ea->cnt);
        ctx->trigger(ctx->parent, ctx->ea->e[ctx->event_idx % ctx->ea->cnt].event);

        /* schedule next event */
        event_init(ctx);
        if (!ctx->flag)
            break;
    }

    event_destroy(ctx);

    mpp_log_f("exit\n");

    return NULL;
}